

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

bool __thiscall PSEngine::check_win_condition(PSEngine *this,WinCondition *p_win_condition)

{
  WinConditionType WVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *this_00;
  reference pCVar5;
  element_type *peVar6;
  element_type *peVar7;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [32];
  reference local_68;
  pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> *cell_content;
  const_iterator __end2;
  const_iterator __begin2;
  map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
  *__range2;
  bool object_found;
  bool on_object_found;
  Cell *cell;
  iterator __end1;
  iterator __begin1;
  vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_> *__range1;
  WinCondition *p_win_condition_local;
  PSEngine *this_local;
  
  this_00 = &(this->m_current_level).cells;
  __end1 = std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::begin(this_00);
  cell = (Cell *)std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::end(this_00);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
                                *)&cell);
    if (!bVar2) {
      return true;
    }
    pCVar5 = __gnu_cxx::
             __normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
             ::operator*(&__end1);
    __range2._7_1_ = std::operator==(&p_win_condition->on_object,(nullptr_t)0x0);
    bVar2 = false;
    __end2 = std::
             map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
             ::begin(&pCVar5->objects);
    cell_content = (pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>
                    *)std::
                      map<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType,_std::less<std::shared_ptr<CompiledGame::PrimaryObject>_>,_std::allocator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>_>
                      ::end(&pCVar5->objects);
    while (bVar3 = std::operator!=(&__end2,(_Self *)&cell_content), bVar3) {
      local_68 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>
                 ::operator*(&__end2);
      if (__range2._7_1_ == false) {
        peVar6 = std::
                 __shared_ptr_access<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&p_win_condition->on_object);
        uVar4 = (*peVar6->_vptr_Object[7])(peVar6,local_68);
        if ((uVar4 & 1) != 0) {
          __range2._7_1_ = true;
        }
      }
      peVar6 = std::
               __shared_ptr_access<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<CompiledGame::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p_win_condition->object);
      uVar4 = (*peVar6->_vptr_Object[7])(peVar6,local_68);
      if ((uVar4 & 1) != 0) {
        bVar2 = true;
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>_>
      ::operator++(&__end2);
    }
    WVar1 = p_win_condition->type;
    if (WVar1 == All) {
      if ((bVar2) && (__range2._7_1_ == false)) {
        return false;
      }
    }
    else if (WVar1 == Some) {
      if ((__range2._7_1_ != false) && (bVar2)) {
        return true;
      }
    }
    else if (WVar1 == No) {
      if ((__range2._7_1_ != false) && (bVar2)) {
        return false;
      }
    }
    else if ((int)(this->m_config).log_verbosity < 5) {
      peVar7 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                          )&this->m_logger);
      std::__cxx11::string::string(local_88,(string *)&m_engine_log_cat_abi_cxx11_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_a8,"should not happen",&local_a9);
      (*peVar7->_vptr_PSLogger[2])(peVar7,4,local_88,local_a8);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator(&local_a9);
      std::__cxx11::string::~string(local_88);
      if (((this->m_config).log_operation_history_after_error & 1U) != 0) {
        print_operation_history(this);
      }
    }
    __gnu_cxx::
    __normal_iterator<PSEngine::Cell_*,_std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool PSEngine::check_win_condition(const CompiledGame::WinCondition& p_win_condition)
{
    for(const auto & cell : m_current_level.cells)
    {

        bool on_object_found = p_win_condition.on_object == nullptr;
        bool object_found = false;
        for(const auto& cell_content : cell.objects)
        {
            if(!on_object_found && p_win_condition.on_object->defines(cell_content.first))
            {
                on_object_found = true;
            }
            if(p_win_condition.object->defines(cell_content.first))
            {
                object_found = true;
            }
        }

        switch (p_win_condition.type)
        {
        case CompiledGame::WinConditionType::Some:
            if(on_object_found && object_found)
            {
                return true;
            }
            break;
        case CompiledGame::WinConditionType::No:
            if(on_object_found && object_found)
            {
                return false;
            }
            break;
        case CompiledGame::WinConditionType::All:
            if(object_found && !on_object_found)
            {
                return false;
            }
            break;
        default:
            PS_LOG_ERROR("should not happen");
            break;
        }
    }
    return true;
}